

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableReaderFields(SwiftGenerator *this,FieldDef *field)

{
  IdlNamer *this_00;
  Value *type_00;
  CodeWriter *pCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  BaseType BVar5;
  EnumDef *pEVar6;
  uint uVar7;
  int iVar8;
  mapped_type *pmVar9;
  long *plVar10;
  undefined8 *puVar11;
  long *plVar12;
  size_type *psVar13;
  undefined8 uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  char *pcVar16;
  char *pcVar17;
  _Alloc_hider _Var18;
  bool bVar19;
  bool bVar20;
  string default_value;
  size_type __dnew_3;
  size_type __dnew_2;
  string is_required;
  size_type __dnew;
  size_type __dnew_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> required_reader;
  string def_Val;
  size_type __dnew_8;
  size_type __dnew_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> const_string;
  string optional;
  string type;
  string field_field;
  string offset;
  key_type local_3f8;
  string local_3d8;
  string local_3b8;
  key_type local_398;
  string local_378;
  string local_358;
  string local_338;
  CodeWriter *local_318;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  NumToString<unsigned_short>(&local_50,(field->value).offset);
  this_00 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_70,this_00,field);
  type_00 = &field->value;
  GenType_abi_cxx11_(&local_90,this,&type_00->type,false);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"FIELDVAR","");
  (*(this_00->super_Namer)._vptr_Namer[7])(&local_310,this_00,field);
  pCVar1 = &this->code_;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pCVar1->value_map_,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  paVar15 = &local_310.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar15) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"FIELDMETHOD","");
  (*(this_00->super_Namer)._vptr_Namer[4])(&local_310,this_00,field);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pCVar1->value_map_,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar15) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"VALUETYPE","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pCVar1->value_map_,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"OFFSET","");
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&local_310,this_00,field,(ulong)(this->namer_).super_Namer.config_.constants);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pCVar1->value_map_,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar15) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"CONSTANT","");
  SwiftConstant_abi_cxx11_(&local_310,this,field);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pCVar1->value_map_,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != paVar15) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  local_318 = pCVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  bVar20 = field->presence == kOptional;
  bVar19 = (field->value).type.base_type - BASE_TYPE_UTYPE < 0xc;
  pcVar16 = "{{CONSTANT}}";
  if (bVar19 && bVar20) {
    pcVar16 = "nil";
  }
  local_310._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_310,pcVar16,pcVar16 + (ulong)(!bVar19 || !bVar20) * 9 + 3);
  pcVar16 = "?";
  pcVar17 = "";
  if (bVar19 && bVar20) {
    pcVar17 = "?";
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,pcVar17,pcVar17 + (bVar19 && bVar20));
  std::operator+(&local_3f8,"return o == 0 ? ",&local_310);
  pCVar1 = local_318;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_3f8);
  local_290 = &local_280;
  plVar12 = plVar10 + 2;
  if ((long *)*plVar10 == plVar12) {
    local_280 = *plVar12;
    lStack_278 = plVar10[3];
  }
  else {
    local_280 = *plVar12;
    local_290 = (long *)*plVar10;
  }
  local_288 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  GenComment(this,&(field->super_Definition).doc_comment);
  BVar5 = (type_00->type).base_type;
  uVar7 = BVar5 - BASE_TYPE_UTYPE;
  if (uVar7 < 0xc) {
    if ((BVar5 == BASE_TYPE_BOOL) || (uVar7 < 10 && (field->value).type.enum_def != (EnumDef *)0x0))
    goto LAB_002ee73b;
    GenReaderMainBody(&local_3d8,this,&local_230);
    paVar15 = &local_3b8.field_2;
    local_378._M_dataplus._M_p = (pointer)0x39;
    local_3b8._M_dataplus._M_p = (pointer)paVar15;
    local_3b8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_3b8,(ulong)&local_378);
    local_3b8.field_2._M_allocated_capacity = (size_type)local_378._M_dataplus._M_p;
    builtin_strncpy((char *)((long)local_3b8._M_dataplus._M_p + 0x29),".{{OFFSE",8);
    builtin_strncpy((char *)((long)local_3b8._M_dataplus._M_p + 0x31),"T}}.v); ",8);
    *(undefined8 *)((long)local_3b8._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
    *(undefined8 *)((long)local_3b8._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
    *(undefined8 *)((long)local_3b8._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
    *(undefined8 *)((long)local_3b8._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
    *(undefined8 *)local_3b8._M_dataplus._M_p = 0x203d206f2074656c;
    *(undefined8 *)((long)local_3b8._M_dataplus._M_p + 8) = 0x5353454343417b7b;
    local_3b8._M_string_length = (size_type)local_378._M_dataplus._M_p;
    local_3b8._M_dataplus._M_p[(long)local_378._M_dataplus._M_p] = '\0';
    uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      uVar14 = local_3d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_378._M_dataplus._M_p + local_3d8._M_string_length) {
      _Var18._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar15) {
        _Var18._M_p = local_378._M_dataplus._M_p;
      }
      if (_Var18._M_p < local_378._M_dataplus._M_p + local_3d8._M_string_length) goto LAB_002ee727;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_3b8,0,(char *)0x0,(ulong)local_3d8._M_dataplus._M_p);
    }
    else {
LAB_002ee727:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_3d8,(ulong)local_3b8._M_dataplus._M_p);
    }
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_338.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_338.field_2._8_8_ = puVar11[3];
    }
    else {
      local_338.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_338._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_338._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *pcVar16 = '\0';
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_290);
    local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_398.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_398.field_2._8_8_ = puVar11[3];
    }
    else {
      local_398.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_398._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_398._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"VALUETYPE","");
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"o","");
    GenReader(&local_378,this,&local_358,&local_2f0);
    uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      uVar14 = local_398.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < (char *)(local_378._M_string_length + local_398._M_string_length)) {
      uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        uVar14 = local_378.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (char *)(local_378._M_string_length + local_398._M_string_length))
      goto LAB_002ef3a4;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_378,0,(char *)0x0,(ulong)local_398._M_dataplus._M_p);
    }
    else {
LAB_002ef3a4:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_398,(ulong)local_378._M_dataplus._M_p);
    }
    pCVar1 = local_318;
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3f8.field_2._8_8_ = puVar11[3];
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    }
    else {
      local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3f8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3f8._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *pcVar16 = '\0';
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_3f8);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_110.field_2._M_allocated_capacity = *psVar13;
      local_110.field_2._8_8_ = plVar10[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar13;
      local_110._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_110._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    CodeWriter::operator+=(pCVar1,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,
                      (ulong)(local_378.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,
                      (ulong)(local_2f0.field_2._M_allocated_capacity + 1));
    }
    paVar3 = &local_398.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      (ulong)(local_358.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != paVar3) {
      operator_delete(local_398._M_dataplus._M_p,
                      (ulong)(local_398.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,
                      (ulong)(local_338.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,
                      (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
    }
    if ((((this->super_BaseGenerator).parser_)->opts).mutable_buffer != true) goto LAB_002f0639;
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"o","");
    local_338._M_dataplus._M_p = (pointer)0x39;
    local_398._M_dataplus._M_p = (pointer)paVar3;
    local_398._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_398,(ulong)&local_338);
    local_398.field_2._M_allocated_capacity = (size_type)local_338._M_dataplus._M_p;
    builtin_strncpy((char *)((long)local_398._M_dataplus._M_p + 0x29),".{{OFFSE",8);
    builtin_strncpy((char *)((long)local_398._M_dataplus._M_p + 0x31),"T}}.v); ",8);
    *(undefined8 *)((long)local_398._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
    *(undefined8 *)((long)local_398._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
    *(undefined8 *)((long)local_398._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
    *(undefined8 *)((long)local_398._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
    *(undefined8 *)local_398._M_dataplus._M_p = 0x203d206f2074656c;
    *(undefined8 *)((long)local_398._M_dataplus._M_p + 8) = 0x5353454343417b7b;
    local_398._M_string_length = (size_type)local_338._M_dataplus._M_p;
    local_398._M_dataplus._M_p[(long)local_338._M_dataplus._M_p] = '\0';
    GenMutate(&local_b0,this,&local_3f8,&local_398,false);
    CodeWriter::operator+=(local_318,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != paVar3) {
LAB_002eef25:
      operator_delete(local_398._M_dataplus._M_p,
                      (ulong)(local_398.field_2._M_allocated_capacity + 1));
    }
LAB_002eef32:
    uVar14 = local_3f8.field_2._M_allocated_capacity;
    _Var18._M_p = local_3f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p == &local_3f8.field_2) goto LAB_002f0639;
    goto LAB_002f0631;
  }
LAB_002ee73b:
  if (BVar5 == BASE_TYPE_BOOL) {
    if (field->presence == kOptional) {
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"nil","");
    }
    else {
      SwiftConstant_abi_cxx11_(&local_3f8,this,field);
    }
    paVar15 = &local_398.field_2;
    local_398._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"CONSTANT","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pCVar1->value_map_,&local_398);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != paVar15) {
      operator_delete(local_398._M_dataplus._M_p,
                      (ulong)(local_398.field_2._M_allocated_capacity + 1));
    }
    local_398._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"VALUETYPE","");
    paVar3 = &local_338.field_2;
    local_338._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"Bool","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pCVar1->value_map_,&local_398);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar3) {
      operator_delete(local_338._M_dataplus._M_p,
                      (ulong)(local_338.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != paVar15) {
      operator_delete(local_398._M_dataplus._M_p,
                      (ulong)(local_398.field_2._M_allocated_capacity + 1));
    }
    GenReaderMainBody(&local_398,this,&local_230);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_398);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_130.field_2._M_allocated_capacity = *psVar13;
      local_130.field_2._8_8_ = plVar10[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar13;
      local_130._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_130._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    CodeWriter::operator+=(pCVar1,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != paVar15) {
      operator_delete(local_398._M_dataplus._M_p,
                      (ulong)(local_398.field_2._M_allocated_capacity + 1));
    }
    local_3b8._M_dataplus._M_p = (pointer)0x39;
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    local_3d8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_3d8,(ulong)&local_3b8);
    local_3d8.field_2._M_allocated_capacity = (size_type)local_3b8._M_dataplus._M_p;
    builtin_strncpy((char *)((long)local_3d8._M_dataplus._M_p + 0x29),".{{OFFSE",8);
    builtin_strncpy((char *)((long)local_3d8._M_dataplus._M_p + 0x31),"T}}.v); ",8);
    *(undefined8 *)((long)local_3d8._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
    *(undefined8 *)((long)local_3d8._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
    *(undefined8 *)((long)local_3d8._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
    *(undefined8 *)((long)local_3d8._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
    *(undefined8 *)local_3d8._M_dataplus._M_p = 0x203d206f2074656c;
    *(undefined8 *)((long)local_3d8._M_dataplus._M_p + 8) = 0x5353454343417b7b;
    local_3d8._M_string_length = (size_type)local_3b8._M_dataplus._M_p;
    local_3d8._M_dataplus._M_p[(long)local_3b8._M_dataplus._M_p] = '\0';
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d8);
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_338.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_338.field_2._8_8_ = puVar11[3];
      local_338._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_338.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_338._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_338._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"VALUETYPE","");
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"o","");
    GenReader(&local_3b8,this,&local_378,&local_358);
    uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar3) {
      uVar14 = local_338.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < (char *)(local_3b8._M_string_length + local_338._M_string_length)) {
      uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        uVar14 = local_3b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (char *)(local_3b8._M_string_length + local_338._M_string_length))
      goto LAB_002eeb63;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_3b8,0,(char *)0x0,(ulong)local_338._M_dataplus._M_p);
    }
    else {
LAB_002eeb63:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_338,(ulong)local_3b8._M_dataplus._M_p);
    }
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_398.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_398.field_2._8_8_ = puVar11[3];
      local_398._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_398.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_398._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_398._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *pcVar16 = '\0';
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_398);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_150.field_2._M_allocated_capacity = *psVar13;
      local_150.field_2._8_8_ = plVar10[3];
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar13;
      local_150._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_150._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    CodeWriter::operator+=(pCVar1,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,
                      (ulong)(local_398.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      (ulong)(local_358.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,
                      (ulong)(local_378.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar3) {
      operator_delete(local_338._M_dataplus._M_p,
                      (ulong)(local_338.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,
                      (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
    }
    if ((((this->super_BaseGenerator).parser_)->opts).mutable_buffer == true) {
      local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"o","");
      local_3d8._M_dataplus._M_p = (pointer)0x39;
      local_338._M_dataplus._M_p = (pointer)paVar3;
      local_338._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_338,(ulong)&local_3d8);
      local_338.field_2._M_allocated_capacity = (size_type)local_3d8._M_dataplus._M_p;
      builtin_strncpy((char *)((long)local_338._M_dataplus._M_p + 0x29),".{{OFFSE",8);
      builtin_strncpy((char *)((long)local_338._M_dataplus._M_p + 0x31),"T}}.v); ",8);
      *(undefined8 *)((long)local_338._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
      *(undefined8 *)((long)local_338._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
      *(undefined8 *)((long)local_338._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
      *(undefined8 *)((long)local_338._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
      *(undefined8 *)local_338._M_dataplus._M_p = 0x203d206f2074656c;
      *(undefined8 *)((long)local_338._M_dataplus._M_p + 8) = 0x5353454343417b7b;
      local_338._M_string_length = (size_type)local_3d8._M_dataplus._M_p;
      local_338._M_dataplus._M_p[(long)local_3d8._M_dataplus._M_p] = '\0';
      GenMutate(&local_d0,this,&local_398,&local_338,false);
      CodeWriter::operator+=(local_318,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar3) {
        operator_delete(local_338._M_dataplus._M_p,
                        (ulong)(local_338.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) goto LAB_002eef25;
    }
    goto LAB_002eef32;
  }
  if ((uVar7 < 10) && ((field->value).type.enum_def != (EnumDef *)0x0)) {
    if (field->presence == kOptional) {
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"nil","");
    }
    else {
      GenEnumDefaultValue_abi_cxx11_(&local_3f8,this,field);
    }
    paVar15 = &local_398.field_2;
    local_398._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"BASEVALUE","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,GenTypeBasic::swift_type[(int)(type_00->type).base_type],
               (allocator<char> *)&local_3d8);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pCVar1->value_map_,&local_398);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,
                      (ulong)(local_338.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != paVar15) {
      operator_delete(local_398._M_dataplus._M_p,
                      (ulong)(local_398.field_2._M_allocated_capacity + 1));
    }
    GenReaderMainBody(&local_398,this,&local_230);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_398);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_170.field_2._M_allocated_capacity = *psVar13;
      local_170.field_2._8_8_ = plVar10[3];
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar13;
      local_170._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_170._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    CodeWriter::operator+=(pCVar1,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != paVar15) {
      operator_delete(local_398._M_dataplus._M_p,
                      (ulong)(local_398.field_2._M_allocated_capacity + 1));
    }
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    local_2d0._M_dataplus._M_p = (pointer)0x39;
    local_2f0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_2f0,(ulong)&local_2d0);
    local_2f0.field_2._M_allocated_capacity = (size_type)local_2d0._M_dataplus._M_p;
    builtin_strncpy((char *)((long)local_2f0._M_dataplus._M_p + 0x29),".{{OFFSE",8);
    builtin_strncpy((char *)((long)local_2f0._M_dataplus._M_p + 0x31),"T}}.v); ",8);
    *(undefined8 *)((long)local_2f0._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
    *(undefined8 *)((long)local_2f0._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
    *(undefined8 *)((long)local_2f0._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
    *(undefined8 *)((long)local_2f0._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
    *(undefined8 *)local_2f0._M_dataplus._M_p = 0x203d206f2074656c;
    *(undefined8 *)((long)local_2f0._M_dataplus._M_p + 8) = 0x5353454343417b7b;
    local_2f0._M_string_length = (size_type)local_2d0._M_dataplus._M_p;
    local_2f0._M_dataplus._M_p[(long)local_2d0._M_dataplus._M_p] = '\0';
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_358.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_358.field_2._8_8_ = puVar11[3];
    }
    else {
      local_358.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_358._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_358._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_358,(ulong)local_3f8._M_dataplus._M_p);
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_378.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_378.field_2._8_8_ = puVar11[3];
    }
    else {
      local_378.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_378._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_378._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
    paVar3 = &local_3b8.field_2;
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3b8.field_2._8_8_ = puVar11[3];
      local_3b8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3b8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3b8._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"o","");
    GenEnumConstructor(&local_2d0,this,&local_2b0);
    uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != paVar3) {
      uVar14 = local_3b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < (char *)(local_3b8._M_string_length + local_2d0._M_string_length)) {
      uVar14 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        uVar14 = local_2d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (char *)(local_3b8._M_string_length + local_2d0._M_string_length))
      goto LAB_002ef20d;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_2d0,0,(char *)0x0,(ulong)local_3b8._M_dataplus._M_p);
    }
    else {
LAB_002ef20d:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_3b8,(ulong)local_2d0._M_dataplus._M_p);
    }
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3d8.field_2._8_8_ = puVar11[3];
    }
    else {
      local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3d8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3d8._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *pcVar16 = '\0';
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d8);
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_338.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_338.field_2._8_8_ = puVar11[3];
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    }
    else {
      local_338.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_338._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_338._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_3f8._M_dataplus._M_p);
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_398.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_398.field_2._8_8_ = puVar11[3];
      local_398._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_398.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_398._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_398._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_398);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_190.field_2._M_allocated_capacity = *psVar13;
      local_190.field_2._8_8_ = plVar10[3];
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    }
    else {
      local_190.field_2._M_allocated_capacity = *psVar13;
      local_190._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_190._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    CodeWriter::operator+=(pCVar1,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != paVar15) {
      operator_delete(local_398._M_dataplus._M_p,
                      (ulong)(local_398.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,
                      (ulong)(local_338.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p,
                      (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,
                      (ulong)(local_2d0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,
                      (ulong)(local_378.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      (ulong)(local_358.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,
                      (ulong)(local_2f0.field_2._M_allocated_capacity + 1));
    }
    if (((((this->super_BaseGenerator).parser_)->opts).mutable_buffer == true) &&
       ((pEVar6 = (field->value).type.enum_def, pEVar6 == (EnumDef *)0x0 ||
        (pEVar6->is_union == false)))) {
      local_398._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"o","");
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      local_3d8._M_dataplus._M_p = (pointer)0x39;
      local_338._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_338,(ulong)&local_3d8);
      local_338.field_2._M_allocated_capacity = (size_type)local_3d8._M_dataplus._M_p;
      builtin_strncpy((char *)((long)local_338._M_dataplus._M_p + 0x29),".{{OFFSE",8);
      builtin_strncpy((char *)((long)local_338._M_dataplus._M_p + 0x31),"T}}.v); ",8);
      *(undefined8 *)((long)local_338._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
      *(undefined8 *)((long)local_338._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
      *(undefined8 *)((long)local_338._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
      *(undefined8 *)((long)local_338._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
      *(undefined8 *)local_338._M_dataplus._M_p = 0x203d206f2074656c;
      *(undefined8 *)((long)local_338._M_dataplus._M_p + 8) = 0x5353454343417b7b;
      local_338._M_string_length = (size_type)local_3d8._M_dataplus._M_p;
      local_338._M_dataplus._M_p[(long)local_3d8._M_dataplus._M_p] = '\0';
      GenMutate(&local_f0,this,&local_398,&local_338,true);
      CodeWriter::operator+=(local_318,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,
                        (ulong)(local_338.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != paVar15) {
        operator_delete(local_398._M_dataplus._M_p,
                        (ulong)(local_398.field_2._M_allocated_capacity + 1));
      }
    }
    uVar14 = local_3f8.field_2._M_allocated_capacity;
    _Var18._M_p = local_3f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p == &local_3f8.field_2) goto LAB_002f0639;
    goto LAB_002f0631;
  }
  bVar19 = field->presence == kRequired;
  if (bVar19) {
    pcVar16 = "!";
  }
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  pcVar17 = "";
  if (bVar19) {
    pcVar17 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,pcVar16,pcVar17);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  if (field->presence == kRequired) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"return ","");
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_338,local_290,local_288 + (long)local_290);
  }
  paVar15 = &local_3f8.field_2;
  iVar8 = (type_00->type).base_type - BASE_TYPE_STRING;
  switch(iVar8) {
  case 0:
switchD_002eef82_caseD_0:
    SwiftConstant_abi_cxx11_(&local_3b8,this,field);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_3b8,0,(char *)0x0,0x374a35);
    pCVar1 = local_318;
    paVar3 = &local_3d8.field_2;
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_3d8.field_2._M_allocated_capacity = *psVar13;
      local_3d8.field_2._8_8_ = plVar10[3];
      local_3d8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_3d8.field_2._M_allocated_capacity = *psVar13;
      local_3d8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_3d8._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d8);
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3f8.field_2._8_8_ = puVar11[3];
      local_3f8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3f8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3f8._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    paVar15 = &local_3b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
    }
    local_3d8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"VALUETYPE","");
    GenType_abi_cxx11_(&local_3b8,this,&type_00->type,false);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pCVar1->value_map_,&local_3d8);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    local_3d8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"CONSTANT","");
    local_3b8._M_dataplus._M_p = (pointer)paVar15;
    if (field->presence == kDefault) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3b8,local_3f8._M_dataplus._M_p,
                 local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"nil","");
    }
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pCVar1->value_map_,&local_3d8);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    GenReaderMainBody(&local_378,this,&local_398);
    paVar2 = &local_358.field_2;
    local_2f0._M_dataplus._M_p = (pointer)0x39;
    local_358._M_dataplus._M_p = (pointer)paVar2;
    local_358._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_358,(ulong)&local_2f0);
    local_358.field_2._M_allocated_capacity = (size_type)local_2f0._M_dataplus._M_p;
    builtin_strncpy((char *)((long)local_358._M_dataplus._M_p + 0x29),".{{OFFSE",8);
    builtin_strncpy((char *)((long)local_358._M_dataplus._M_p + 0x31),"T}}.v); ",8);
    *(undefined8 *)((long)local_358._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
    *(undefined8 *)((long)local_358._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
    *(undefined8 *)((long)local_358._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
    *(undefined8 *)((long)local_358._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
    *(undefined8 *)local_358._M_dataplus._M_p = 0x203d206f2074656c;
    *(undefined8 *)((long)local_358._M_dataplus._M_p + 8) = 0x5353454343417b7b;
    local_358._M_string_length = (size_type)local_2f0._M_dataplus._M_p;
    local_358._M_dataplus._M_p[(long)local_2f0._M_dataplus._M_p] = '\0';
    uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      uVar14 = local_378.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_2f0._M_dataplus._M_p + local_378._M_string_length) {
      _Var18._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != paVar2) {
        _Var18._M_p = local_2f0._M_dataplus._M_p;
      }
      if (_Var18._M_p < local_2f0._M_dataplus._M_p + local_378._M_string_length) goto LAB_002f00a2;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_358,0,(char *)0x0,(ulong)local_378._M_dataplus._M_p);
    }
    else {
LAB_002f00a2:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_378,(ulong)local_358._M_dataplus._M_p);
    }
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3b8.field_2._8_8_ = puVar11[3];
      local_3b8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3b8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3b8._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *pcVar16 = '\0';
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3b8,(ulong)local_338._M_dataplus._M_p);
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3d8.field_2._8_8_ = puVar11[3];
      local_3d8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3d8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3d8._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_3d8);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_1d0.field_2._M_allocated_capacity = *psVar13;
      local_1d0.field_2._8_8_ = plVar10[3];
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *psVar13;
      local_1d0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_1d0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    CodeWriter::operator+=(pCVar1,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,
                      (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != paVar2) {
      operator_delete(local_358._M_dataplus._M_p,
                      (ulong)(local_358.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,
                      (ulong)(local_378.field_2._M_allocated_capacity + 1));
    }
    std::operator+(&local_3d8,"{{ACCESS_TYPE}} var {{FIELDVAR}}SegmentArray: [UInt8]",&local_398);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_3d8);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_1f0.field_2._M_allocated_capacity = *psVar13;
      local_1f0.field_2._8_8_ = plVar10[3];
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    }
    else {
      local_1f0.field_2._M_allocated_capacity = *psVar13;
      local_1f0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_1f0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    CodeWriter::operator+=(local_318,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,
                      (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
    }
    uVar14 = local_3f8.field_2._M_allocated_capacity;
    _Var18._M_p = local_3f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) goto LAB_002f05f0;
    break;
  case 1:
  case 4:
switchD_002eef82_caseD_1:
    GenTableReaderVectorFields(this,field);
    break;
  case 2:
    if ((((field->value).type.struct_def)->fixed != true) ||
       (((field->value).type.struct_def)->fixed != true)) {
      switch(iVar8) {
      case 0:
        goto switchD_002eef82_caseD_0;
      case 1:
      case 4:
        goto switchD_002eef82_caseD_1;
      case 2:
        goto switchD_002efcc6_caseD_2;
      case 3:
        goto switchD_002eef82_caseD_3;
      default:
        goto switchD_002eef82_default;
      }
    }
    local_3f8._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"VALUETYPE","");
    GenType_abi_cxx11_(&local_3d8,this,&type_00->type,false);
    pCVar1 = local_318;
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&local_318->value_map_,&local_3f8);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    paVar3 = &local_3d8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,
                      (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
    }
    local_3f8._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"CONSTANT","");
    local_3d8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nil","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&pCVar1->value_map_,&local_3f8);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,
                      (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
    }
    GenReaderMainBody(&local_3b8,this,&local_398);
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    local_358._M_dataplus._M_p = (char *)0x39;
    local_378._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_378,(ulong)&local_358);
    local_378.field_2._M_allocated_capacity = (size_type)local_358._M_dataplus._M_p;
    builtin_strncpy(local_378._M_dataplus._M_p,
                    "let o = {{ACCESS}}.offset({{TABLEOFFSET}}.{{OFFSET}}.v); ",0x39);
    local_378._M_string_length = (size_type)local_358._M_dataplus._M_p;
    local_378._M_dataplus._M_p[(long)local_358._M_dataplus._M_p] = '\0';
    uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      uVar14 = local_3b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_358._M_dataplus._M_p + local_3b8._M_string_length) {
      _Var18._M_p = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        _Var18._M_p = local_358._M_dataplus._M_p;
      }
      if (_Var18._M_p < local_358._M_dataplus._M_p + local_3b8._M_string_length) goto LAB_002efc98;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_378,0,(char *)0x0,(ulong)local_3b8._M_dataplus._M_p);
    }
    else {
LAB_002efc98:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_3b8,(ulong)local_378._M_dataplus._M_p);
    }
    psVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_3d8.field_2._M_allocated_capacity = *psVar13;
      local_3d8.field_2._8_8_ = puVar11[3];
      local_3d8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_3d8.field_2._M_allocated_capacity = *psVar13;
      local_3d8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3d8._M_string_length = puVar11[1];
    *puVar11 = psVar13;
    puVar11[1] = 0;
    *(undefined1 *)psVar13 = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_3d8,(ulong)local_338._M_dataplus._M_p);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_3f8.field_2._M_allocated_capacity = *psVar13;
      local_3f8.field_2._8_8_ = plVar10[3];
      local_3f8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_3f8.field_2._M_allocated_capacity = *psVar13;
      local_3f8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_3f8._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_3f8);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_1b0.field_2._M_allocated_capacity = *psVar13;
      local_1b0.field_2._8_8_ = plVar10[3];
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    }
    else {
      local_1b0.field_2._M_allocated_capacity = *psVar13;
      local_1b0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_1b0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    CodeWriter::operator+=(pCVar1,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    paVar15 = &local_3f8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,
                      (ulong)(local_378.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
    }
    local_3f8._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"FIELDVAR","");
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"mutable","");
    Namer::Variable(&local_3d8,&this_00->super_Namer,&local_3b8,&local_70);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&local_318->value_map_,&local_3f8);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    local_3f8._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"VALUETYPE","");
    GenType_abi_cxx11_(&local_3b8,this,&type_00->type,false);
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    local_378.field_2._M_allocated_capacity = 0x656c626174754d5f;
    local_378._M_string_length = 8;
    local_378.field_2._8_8_ = local_378.field_2._8_8_ & 0xffffffffffffff00;
    uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      uVar14 = local_3b8.field_2._M_allocated_capacity;
    }
    if (((size_type *)(local_3b8._M_string_length + 8) < (size_type *)0x10) &&
       ((ulong)uVar14 < (size_type *)(local_3b8._M_string_length + 8))) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_378,0,(char *)0x0,(ulong)local_3b8._M_dataplus._M_p);
    }
    else {
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_3b8,(ulong)&local_378.field_2);
    }
    psVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_3d8.field_2._M_allocated_capacity = *psVar13;
      local_3d8.field_2._8_8_ = puVar11[3];
      local_3d8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_3d8.field_2._M_allocated_capacity = *psVar13;
      local_3d8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3d8._M_string_length = puVar11[1];
    *puVar11 = psVar13;
    puVar11[1] = 0;
    *(undefined1 *)psVar13 = 0;
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&local_318->value_map_,&local_3f8);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    local_3f8._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"CONSTANT","");
    local_3d8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nil","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&local_318->value_map_,&local_3f8);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    GenReaderMainBody(&local_3b8,this,&local_398);
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    local_358._M_dataplus._M_p = (pointer)0x39;
    local_378._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_378,(ulong)&local_358);
    local_378.field_2._M_allocated_capacity = (size_type)local_358._M_dataplus._M_p;
    builtin_strncpy((char *)((long)local_378._M_dataplus._M_p + 0x29),".{{OFFSE",8);
    builtin_strncpy((char *)((long)local_378._M_dataplus._M_p + 0x31),"T}}.v); ",8);
    *(undefined8 *)((long)local_378._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
    *(undefined8 *)((long)local_378._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
    *(undefined8 *)((long)local_378._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
    *(undefined8 *)((long)local_378._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
    *(undefined8 *)local_378._M_dataplus._M_p = 0x203d206f2074656c;
    *(undefined8 *)((long)local_378._M_dataplus._M_p + 8) = 0x5353454343417b7b;
    local_378._M_string_length = (size_type)local_358._M_dataplus._M_p;
    local_378._M_dataplus._M_p[(long)local_358._M_dataplus._M_p] = '\0';
    uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      uVar14 = local_3b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_358._M_dataplus._M_p + local_3b8._M_string_length) {
      _Var18._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        _Var18._M_p = local_358._M_dataplus._M_p;
      }
      if (_Var18._M_p < local_358._M_dataplus._M_p + local_3b8._M_string_length) goto LAB_002f0e4a;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_378,0,(char *)0x0,(ulong)local_3b8._M_dataplus._M_p);
    }
    else {
LAB_002f0e4a:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_3b8,(ulong)local_378._M_dataplus._M_p);
    }
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3d8.field_2._8_8_ = puVar11[3];
      local_3d8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3d8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3d8._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *pcVar16 = '\0';
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3d8,(ulong)local_338._M_dataplus._M_p);
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3f8.field_2._8_8_ = puVar11[3];
      local_3f8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3f8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3f8._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f0,"o + {{ACCESS}}.position","");
    GenConstructor(&local_358,this,&local_2f0);
    uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar15) {
      uVar14 = local_3f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < (char *)(local_358._M_string_length + local_3f8._M_string_length)) {
      uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        uVar14 = local_358.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < (char *)(local_358._M_string_length + local_3f8._M_string_length))
      goto LAB_002f0f96;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_358,0,(char *)0x0,(ulong)local_3f8._M_dataplus._M_p);
    }
    else {
LAB_002f0f96:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_3f8,(ulong)local_358._M_dataplus._M_p);
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    psVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_250.field_2._M_allocated_capacity = *psVar13;
      local_250.field_2._8_8_ = puVar11[3];
    }
    else {
      local_250.field_2._M_allocated_capacity = *psVar13;
      local_250._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_250._M_string_length = puVar11[1];
    *puVar11 = psVar13;
    puVar11[1] = 0;
    *(undefined1 *)psVar13 = 0;
    CodeWriter::operator+=(local_318,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,
                      (ulong)(local_358.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,
                      (ulong)(local_2f0.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,
                      (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,
                      (ulong)(local_378.field_2._M_allocated_capacity + 1));
    }
    uVar14 = local_3b8.field_2._M_allocated_capacity;
    _Var18._M_p = local_3b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p == &local_3b8.field_2) break;
    goto LAB_002f05f0;
  case 3:
switchD_002eef82_caseD_3:
    local_3f8._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"CONSTANT","");
    paVar3 = &local_3d8.field_2;
    local_3d8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nil","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&local_318->value_map_,&local_3f8);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,
                      (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
    }
    std::operator+(&local_378,
                   "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: FlatbuffersInitializable>(type: T.Type) -> T"
                   ,&local_398);
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_378);
    paVar2 = &local_3b8.field_2;
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3b8.field_2._8_8_ = puVar11[3];
      local_3b8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3b8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3b8._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    paVar4 = &local_358.field_2;
    local_2f0._M_dataplus._M_p = (pointer)0x39;
    local_358._M_dataplus._M_p = (pointer)paVar4;
    local_358._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_358,(ulong)&local_2f0);
    local_358.field_2._M_allocated_capacity = (size_type)local_2f0._M_dataplus._M_p;
    builtin_strncpy((char *)((long)local_358._M_dataplus._M_p + 0x29),".{{OFFSE",8);
    builtin_strncpy((char *)((long)local_358._M_dataplus._M_p + 0x31),"T}}.v); ",8);
    *(undefined8 *)((long)local_358._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
    *(undefined8 *)((long)local_358._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
    *(undefined8 *)((long)local_358._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
    *(undefined8 *)((long)local_358._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
    *(undefined8 *)local_358._M_dataplus._M_p = 0x203d206f2074656c;
    *(undefined8 *)((long)local_358._M_dataplus._M_p + 8) = 0x5353454343417b7b;
    local_358._M_string_length = (size_type)local_2f0._M_dataplus._M_p;
    local_358._M_dataplus._M_p[(long)local_2f0._M_dataplus._M_p] = '\0';
    uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != paVar2) {
      uVar14 = local_3b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_2f0._M_dataplus._M_p + local_3b8._M_string_length) {
      _Var18._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != paVar4) {
        _Var18._M_p = local_2f0._M_dataplus._M_p;
      }
      if (_Var18._M_p < local_2f0._M_dataplus._M_p + local_3b8._M_string_length) goto LAB_002f019b;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_358,0,(char *)0x0,(ulong)local_3b8._M_dataplus._M_p);
    }
    else {
LAB_002f019b:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_3b8,(ulong)local_358._M_dataplus._M_p);
    }
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3d8.field_2._8_8_ = puVar11[3];
      local_3d8._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3d8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3d8._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *pcVar16 = '\0';
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3d8,(ulong)local_338._M_dataplus._M_p);
    pcVar16 = (char *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar16) {
      local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3f8.field_2._8_8_ = puVar11[3];
      local_3f8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
      local_3f8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_3f8._M_string_length = puVar11[1];
    *puVar11 = pcVar16;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_3f8);
    psVar13 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_210.field_2._M_allocated_capacity = *psVar13;
      local_210.field_2._8_8_ = plVar10[3];
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    }
    else {
      local_210.field_2._M_allocated_capacity = *psVar13;
      local_210._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_210._M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    CodeWriter::operator+=(local_318,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_3d8._M_dataplus._M_p,
                      (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != paVar4) {
      operator_delete(local_358._M_dataplus._M_p,
                      (ulong)(local_358.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
    }
    uVar14 = local_378.field_2._M_allocated_capacity;
    _Var18._M_p = local_378._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) goto LAB_002f05f0;
    break;
  default:
switchD_002eef82_default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_swift.cpp"
                  ,0x318,
                  "void flatbuffers::swift::SwiftGenerator::GenTableReaderFields(const FieldDef &)")
    ;
  }
  goto LAB_002f05f8;
switchD_002efcc6_caseD_2:
  local_3f8._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"VALUETYPE","");
  GenType_abi_cxx11_(&local_3d8,this,&type_00->type,false);
  pCVar1 = local_318;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&local_318->value_map_,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  paVar3 = &local_3d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d8._M_dataplus._M_p,(ulong)(local_3d8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar15) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"CONSTANT","");
  local_3d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nil","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pCVar1->value_map_,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d8._M_dataplus._M_p,(ulong)(local_3d8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar15) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  GenReaderMainBody(&local_378,this,&local_398);
  paVar15 = &local_358.field_2;
  local_3f8._M_dataplus._M_p = (pointer)0x39;
  local_358._M_dataplus._M_p = (pointer)paVar15;
  local_358._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_358,(ulong)&local_3f8);
  local_358.field_2._M_allocated_capacity = (size_type)local_3f8._M_dataplus._M_p;
  builtin_strncpy((char *)((long)local_358._M_dataplus._M_p + 0x29),".{{OFFSE",8);
  builtin_strncpy((char *)((long)local_358._M_dataplus._M_p + 0x31),"T}}.v); ",8);
  *(undefined8 *)((long)local_358._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
  *(undefined8 *)((long)local_358._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
  *(undefined8 *)((long)local_358._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
  *(undefined8 *)((long)local_358._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
  *(undefined8 *)local_358._M_dataplus._M_p = 0x203d206f2074656c;
  *(undefined8 *)((long)local_358._M_dataplus._M_p + 8) = 0x5353454343417b7b;
  local_358._M_string_length = (size_type)local_3f8._M_dataplus._M_p;
  local_358._M_dataplus._M_p[(long)local_3f8._M_dataplus._M_p] = '\0';
  uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    uVar14 = local_378.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_3f8._M_dataplus._M_p + local_378._M_string_length) {
    _Var18._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != paVar15) {
      _Var18._M_p = local_3f8._M_dataplus._M_p;
    }
    if (_Var18._M_p < local_3f8._M_dataplus._M_p + local_378._M_string_length) goto LAB_002f08e2;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_358,0,(char *)0x0,(ulong)local_378._M_dataplus._M_p);
  }
  else {
LAB_002f08e2:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_358._M_dataplus._M_p);
  }
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  pcVar16 = (char *)(puVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar16) {
    local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
    local_3b8.field_2._8_8_ = puVar11[3];
  }
  else {
    local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
    local_3b8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_3b8._M_string_length = puVar11[1];
  *puVar11 = pcVar16;
  puVar11[1] = 0;
  *pcVar16 = '\0';
  puVar11 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_3b8,(ulong)local_338._M_dataplus._M_p);
  pcVar16 = (char *)(puVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar16) {
    local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
    local_3d8.field_2._8_8_ = puVar11[3];
    local_3d8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
    local_3d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_3d8._M_string_length = puVar11[1];
  *puVar11 = pcVar16;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"o + {{ACCESS}}.position","")
  ;
  std::operator+(&local_3f8,"{{ACCESS}}.indirect(",&local_2b0);
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f8);
  pcVar16 = (char *)(puVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar16) {
    local_2d0.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
    local_2d0.field_2._8_8_ = puVar11[3];
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *(undefined8 *)pcVar16;
    local_2d0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_2d0._M_string_length = puVar11[1];
  *puVar11 = pcVar16;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  GenConstructor(&local_2f0,this,&local_2d0);
  uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    uVar14 = local_3d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < (char *)(local_2f0._M_string_length + local_3d8._M_string_length)) {
    uVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      uVar14 = local_2f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < (char *)(local_2f0._M_string_length + local_3d8._M_string_length))
    goto LAB_002f12c1;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_2f0,0,(char *)0x0,(ulong)local_3d8._M_dataplus._M_p);
  }
  else {
LAB_002f12c1:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3d8,(ulong)local_2f0._M_dataplus._M_p);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_270.field_2._M_allocated_capacity = *psVar13;
    local_270.field_2._8_8_ = puVar11[3];
  }
  else {
    local_270.field_2._M_allocated_capacity = *psVar13;
    local_270._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_270._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  CodeWriter::operator+=(pCVar1,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,(ulong)(local_2f0.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,(ulong)(local_2d0.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d8._M_dataplus._M_p,(ulong)(local_3d8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,(ulong)(local_3b8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != paVar15) {
    operator_delete(local_358._M_dataplus._M_p,(ulong)(local_358.field_2._M_allocated_capacity + 1))
    ;
  }
  uVar14 = local_378.field_2._M_allocated_capacity;
  _Var18._M_p = local_378._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p == &local_378.field_2) goto LAB_002f05f8;
LAB_002f05f0:
  operator_delete(_Var18._M_p,(ulong)(uVar14 + 1));
LAB_002f05f8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,(ulong)(local_338.field_2._M_allocated_capacity + 1))
    ;
  }
  uVar14 = local_398.field_2._M_allocated_capacity;
  _Var18._M_p = local_398._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p == &local_398.field_2) goto LAB_002f0639;
LAB_002f0631:
  operator_delete(_Var18._M_p,(ulong)(uVar14 + 1));
LAB_002f0639:
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenTableReaderFields(const FieldDef &field) {
    const auto offset = NumToString(field.value.offset);
    const auto field_field = namer_.Field(field);
    const auto type = GenType(field.value.type);
    code_.SetValue("FIELDVAR", namer_.Variable(field));
    code_.SetValue("FIELDMETHOD", namer_.Method(field));
    code_.SetValue("VALUETYPE", type);
    code_.SetValue("OFFSET", namer_.Constant(field.name));
    code_.SetValue("CONSTANT", SwiftConstant(field));
    bool opt_scalar =
        field.IsOptional() && IsScalar(field.value.type.base_type);
    std::string def_Val = opt_scalar ? "nil" : "{{CONSTANT}}";
    std::string optional = opt_scalar ? "?" : "";
    const auto const_string = "return o == 0 ? " + def_Val + " : ";
    GenComment(field.doc_comment);
    if (IsScalar(field.value.type.base_type) && !IsEnum(field.value.type) &&
        !IsBool(field.value.type.base_type)) {
      code_ += GenReaderMainBody(optional) + GenOffset() + const_string +
               GenReader("VALUETYPE", "o") + " }";
      if (parser_.opts.mutable_buffer) code_ += GenMutate("o", GenOffset());
      return;
    }

    if (IsBool(field.value.type.base_type)) {
      std::string default_value =
          field.IsOptional() ? "nil" : SwiftConstant(field);
      code_.SetValue("CONSTANT", default_value);
      code_.SetValue("VALUETYPE", "Bool");
      code_ += GenReaderMainBody(optional) + "\\";
      code_ += GenOffset() +
               "return o == 0 ? {{CONSTANT}} : " + GenReader("VALUETYPE", "o") +
               " }";
      if (parser_.opts.mutable_buffer) code_ += GenMutate("o", GenOffset());
      return;
    }

    if (IsEnum(field.value.type)) {
      const auto default_value =
          field.IsOptional() ? "nil" : GenEnumDefaultValue(field);
      code_.SetValue("BASEVALUE", GenTypeBasic(field.value.type, false));
      code_ += GenReaderMainBody(optional) + "\\";
      code_ += GenOffset() + "return o == 0 ? " + default_value + " : " +
               GenEnumConstructor("o") + "?? " + default_value + " }";
      if (parser_.opts.mutable_buffer && !IsUnion(field.value.type))
        code_ += GenMutate("o", GenOffset(), true);
      return;
    }

    const std::string is_required = field.IsRequired() ? "!" : "?";
    const auto required_reader = field.IsRequired() ? "return " : const_string;

    if (IsStruct(field.value.type) && field.value.type.struct_def->fixed) {
      code_.SetValue("VALUETYPE", GenType(field.value.type));
      code_.SetValue("CONSTANT", "nil");
      code_ += GenReaderMainBody(is_required) + GenOffset() + required_reader +
               "{{ACCESS}}.readBuffer(of: {{VALUETYPE}}.self, at: o) }";
      code_.SetValue("FIELDVAR", namer_.Variable("mutable", field_field));
      code_.SetValue("VALUETYPE", GenType(field.value.type) + Mutable());
      code_.SetValue("CONSTANT", "nil");
      code_ += GenReaderMainBody(is_required) + GenOffset() + required_reader +
               GenConstructor("o + {{ACCESS}}.position");
      return;
    }
    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT:
        code_.SetValue("VALUETYPE", GenType(field.value.type));
        code_.SetValue("CONSTANT", "nil");
        code_ += GenReaderMainBody(is_required) + GenOffset() +
                 required_reader +
                 GenConstructor(GenIndirect("o + {{ACCESS}}.position"));
        break;

      case BASE_TYPE_STRING: {
        const auto default_string = "\"" + SwiftConstant(field) + "\"";
        code_.SetValue("VALUETYPE", GenType(field.value.type));
        code_.SetValue("CONSTANT", field.IsDefault() ? default_string : "nil");
        code_ += GenReaderMainBody(is_required) + GenOffset() +
                 required_reader + "{{ACCESS}}.string(at: o) }";
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}SegmentArray: [UInt8]" +
                 is_required +
                 " { return "
                 "{{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) }";
        break;
      }
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_VECTOR: GenTableReaderVectorFields(field); break;
      case BASE_TYPE_UNION:
        code_.SetValue("CONSTANT", "nil");
        code_ +=
            "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: "
            "FlatbuffersInitializable>(type: "
            "T.Type) -> T" +
            is_required + " { " + GenOffset() + required_reader +
            "{{ACCESS}}.union(o) }";
        break;
      default: FLATBUFFERS_ASSERT(0);
    }
  }